

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O0

int LoadBuildProduct(TCascStorage *hs,char *param_2,char *szDataBegin,char *szDataEnd,void *param_5)

{
  int iVar1;
  long local_38;
  size_t i;
  void *param_4_local;
  char *szDataEnd_local;
  char *szDataBegin_local;
  char *param_1_local;
  TCascStorage *hs_local;
  
  local_38 = 0;
  while( true ) {
    if (GameIds[local_38].szGameInfo == (char *)0x0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascFiles.cpp"
                    ,0x1d4,
                    "int LoadBuildProduct(TCascStorage *, const char *, const char *, const char *, void *)"
                   );
    }
    if (((long)szDataEnd - (long)szDataBegin == GameIds[local_38].cchGameInfo) &&
       (iVar1 = strncasecmp(szDataBegin,GameIds[local_38].szGameInfo,GameIds[local_38].cchGameInfo),
       iVar1 == 0)) break;
    local_38 = local_38 + 1;
  }
  hs->dwGameInfo = GameIds[local_38].dwGameInfo;
  return 0;
}

Assistant:

static int LoadBuildProduct(TCascStorage * hs, const char * /* szVariableName */, const char * szDataBegin, const char * szDataEnd, void * /* pvParam */)
{
    // Go through all games that we support
    for(size_t i = 0; GameIds[i].szGameInfo != NULL; i++)
    {
        // Check the length of the variable
        if((size_t)(szDataEnd - szDataBegin) == GameIds[i].cchGameInfo)
        {
            // Check the string
            if(!_strnicmp(szDataBegin, GameIds[i].szGameInfo, GameIds[i].cchGameInfo))
            {
                hs->dwGameInfo = GameIds[i].dwGameInfo;
                return ERROR_SUCCESS;
            }
        }
    }

    // Unknown/unsupported game
    assert(false);
    return ERROR_BAD_FORMAT;
}